

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O2

void av1_count_overlappable_neighbors(AV1_COMMON *cm,MACROBLOCKD *xd)

{
  MB_MODE_INFO *pMVar1;
  byte bVar2;
  uint8_t *fun_ctxt;
  
  pMVar1 = *xd->mi;
  pMVar1->overlappable_neighbors = '\0';
  bVar2 = block_size_high[pMVar1->bsize];
  if (block_size_wide[pMVar1->bsize] < block_size_high[pMVar1->bsize]) {
    bVar2 = block_size_wide[pMVar1->bsize];
  }
  if (7 < bVar2) {
    fun_ctxt = &pMVar1->overlappable_neighbors;
    foreach_overlappable_nb_above(cm,xd,0x7fffffff,increment_int_ptr,fun_ctxt);
    if (*fun_ctxt == '\0') {
      foreach_overlappable_nb_left(cm,xd,0x7fffffff,increment_int_ptr,fun_ctxt);
      return;
    }
  }
  return;
}

Assistant:

void av1_count_overlappable_neighbors(const AV1_COMMON *cm, MACROBLOCKD *xd) {
  MB_MODE_INFO *mbmi = xd->mi[0];

  mbmi->overlappable_neighbors = 0;

  if (!is_motion_variation_allowed_bsize(mbmi->bsize)) return;

  foreach_overlappable_nb_above(cm, xd, INT_MAX, increment_int_ptr,
                                &mbmi->overlappable_neighbors);
  if (mbmi->overlappable_neighbors) return;
  foreach_overlappable_nb_left(cm, xd, INT_MAX, increment_int_ptr,
                               &mbmi->overlappable_neighbors);
}